

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Display.cpp
# Opt level: O0

bool __thiscall
MT32Emu::Display::customDisplayMessageReceived
          (Display *this,Bit8u *message,Bit32u startIndex,Bit32u length)

{
  bool bVar1;
  byte local_2d;
  uint local_2c;
  Bit32u BStack_28;
  Bit8u c;
  Bit32u i;
  Bit32u length_local;
  Bit32u startIndex_local;
  Bit8u *message_local;
  Display *this_local;
  
  bVar1 = Synth::isDisplayOldMT32Compatible(this->synth);
  if (bVar1) {
    for (local_2c = 0; local_2c < 0x14; local_2c = local_2c + 1) {
      if (local_2c < length) {
        local_2d = message[local_2c];
      }
      else {
        local_2d = 0x20;
      }
      if ((local_2d < 0x20) || (0x7f < local_2d)) {
        local_2d = 0x20;
      }
      this->customMessageBuffer[local_2c] = local_2d;
    }
    if (((*(ushort *)this->synth->controlROMFeatures >> 8 & 1) == 0) &&
       ((this->mode == Mode_PROGRAM_CHANGE || (this->mode == Mode_ERROR_MESSAGE)))) {
      return false;
    }
  }
  else {
    if (0x80 < startIndex) {
      return false;
    }
    if (startIndex == 0x80) {
      if (this->mode != Mode_PROGRAM_CHANGE) {
        setMainDisplayMode(this);
      }
      return false;
    }
    this->displayResetScheduled = false;
    if (startIndex < 0x14) {
      BStack_28 = length;
      if (0x14 - startIndex < length) {
        BStack_28 = 0x14 - startIndex;
      }
      memcpy(this->customMessageBuffer + startIndex,message,(ulong)BStack_28);
    }
  }
  this->mode = Mode_CUSTOM_MESSAGE;
  this->lcdDirty = true;
  return true;
}

Assistant:

bool Display::customDisplayMessageReceived(const Bit8u *message, Bit32u startIndex, Bit32u length) {
	if (synth.isDisplayOldMT32Compatible()) {
		for (Bit32u i = 0; i < LCD_TEXT_SIZE; i++) {
			Bit8u c = i < length ? message[i] : ' ';
			if (c < 32 || 127 < c) c = ' ';
			customMessageBuffer[i] = c;
		}
		if (!synth.controlROMFeatures->quirkDisplayCustomMessagePriority
			&& (mode == Mode_PROGRAM_CHANGE || mode == Mode_ERROR_MESSAGE)) return false;
		// Note, real devices keep the display reset timer running.
	} else {
		if (startIndex > 0x80) return false;
		if (startIndex == 0x80) {
			if (mode != Mode_PROGRAM_CHANGE) setMainDisplayMode();
			return false;
		}
		displayResetScheduled = false;
		if (startIndex < LCD_TEXT_SIZE) {
			if (length > LCD_TEXT_SIZE - startIndex) length = LCD_TEXT_SIZE - startIndex;
			memcpy(customMessageBuffer + startIndex, message, length);
		}
	}
	mode = Mode_CUSTOM_MESSAGE;
	lcdDirty = true;
	return true;
}